

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t internal_exr_write_header(_internal_exr_context *ctxt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  int a_1;
  exr_attribute_t *curattr;
  int a;
  _internal_exr_part *curp;
  int p;
  uint8_t next_byte;
  uint32_t flags;
  uint32_t magic_and_version [2];
  exr_result_t rv;
  int local_44;
  exr_attribute_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_28;
  undefined1 local_21;
  uint local_20;
  undefined4 local_1c;
  uint local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_20 = 2;
  if (*(char *)(in_RDI + 5) != '\0') {
    local_20 = 0x1002;
  }
  if (0x1f < *(byte *)(in_RDI + 2)) {
    local_20 = local_20 | 0x400;
  }
  if (*(char *)(in_RDI + 4) != '\0') {
    local_20 = local_20 | 0x800;
  }
  if (*(char *)(in_RDI + 3) != '\0') {
    local_20 = local_20 | 0x200;
  }
  local_1c = 0x1312f76;
  local_18 = local_20;
  local_10 = in_RDI;
  priv_from_native32(&local_1c,2);
  local_14 = (**(code **)(local_10 + 0x30))(local_10,&local_1c,8,local_10 + 0xb0);
  local_4 = local_14;
  if (local_14 == 0) {
    local_28 = 0;
    while( true ) {
      bVar2 = false;
      if (local_14 == 0) {
        bVar2 = local_28 < *(int *)(local_10 + 0xc4);
      }
      if (!bVar2) break;
      lVar1 = *(long *)(*(long *)(local_10 + 0x1d8) + (long)local_28 * 8);
      if (*(char *)(local_10 + 0x1f9) == '\0') {
        local_44 = 0;
        while ((local_44 < *(int *)(lVar1 + 8) &&
               (local_14 = save_attr((_internal_exr_context *)
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                     in_stack_ffffffffffffffc0), local_14 == 0))) {
          local_44 = local_44 + 1;
        }
      }
      else {
        in_stack_ffffffffffffffcc = 0;
        while ((in_stack_ffffffffffffffcc < *(int *)(lVar1 + 8) &&
               ((((in_stack_ffffffffffffffc0 =
                        *(exr_attribute_t **)
                         (*(long *)(lVar1 + 0x18) + (long)in_stack_ffffffffffffffcc * 8),
                  (local_20 & 0x1800) == 0 && (*(int *)(local_10 + 0xc4) == 1)) &&
                 ((iVar3 = strcmp(in_stack_ffffffffffffffc0->name,"type"), iVar3 == 0 ||
                  (iVar3 = strcmp(in_stack_ffffffffffffffc0->name,"name"), iVar3 == 0)))) ||
                (local_14 = save_attr((_internal_exr_context *)
                                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc0), local_14 == 0))))) {
          in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1;
        }
      }
      if (local_14 == 0) {
        local_21 = 0;
        local_14 = (**(code **)(local_10 + 0x30))(local_10,&local_21,1,local_10 + 0xb0);
      }
      local_28 = local_28 + 1;
    }
    if ((local_14 == 0) && (*(char *)(local_10 + 5) != '\0')) {
      local_21 = 0;
      local_14 = (**(code **)(local_10 + 0x30))(local_10,&local_21,1,local_10 + 0xb0);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_write_header (struct _internal_exr_context* ctxt)
{
    exr_result_t rv;
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    uint8_t      next_byte;

    flags = 2; // EXR_VERSION
    if (ctxt->is_multipart) flags |= EXR_MULTI_PART_FLAG;
    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
        flags |= EXR_LONG_NAMES_FLAG;
    if (ctxt->has_nonimage_data) flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) flags |= EXR_TILED_FLAG;

    magic_and_version[0] = 20000630;
    magic_and_version[1] = flags;

    priv_from_native32 (magic_and_version, 2);

    rv = ctxt->do_write (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = ctxt->parts[p];
        if (ctxt->legacy_header)
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t *curattr = curp->attributes.sorted_entries[a];
                if (0 == (flags & (EXR_MULTI_PART_FLAG |EXR_NON_IMAGE_FLAG)) &&
                    1 == ctxt->num_parts)
                {
                    if (0 == strcmp (curattr->name, "type") ||
                        0 == strcmp (curattr->name, "name"))
                    {
                        /* old file wouldn't have had this */
                        continue;
                    }
                }
                rv = save_attr (ctxt, curattr);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }
        else
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                rv = save_attr (ctxt, curp->attributes.entries[a]);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }

        /* indicate this part is finished */
        if (rv == EXR_ERR_SUCCESS)
        {
            next_byte = 0;
            rv        = ctxt->do_write (
                ctxt,
                &next_byte,
                sizeof (uint8_t),
                &(ctxt->output_file_offset));
        }
    }

    /* for multipart write a double terminator at the end */
    if (rv == EXR_ERR_SUCCESS && ctxt->is_multipart)
    {
        next_byte = 0;
        rv        = ctxt->do_write (
            ctxt, &next_byte, sizeof (uint8_t), &(ctxt->output_file_offset));
    }

    return rv;
}